

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::create_cp_variable
          (Proof *this,int pattern_vertex,int target_size,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *pattern_name,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *target_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  stringstream am1_constraint;
  stringstream al1_constraint;
  int local_3c4;
  Proof *local_3c0;
  int local_3b4;
  tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  int local_35c;
  ulong local_358;
  pair<int,_int> local_350;
  _Any_data *local_348;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Head_base<1UL,_long,_false> local_320;
  _Head_base<0UL,_long,_false> local_318;
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base aiStack_138 [264];
  
  local_358 = (ulong)(uint)target_size;
  local_3c4 = pattern_vertex;
  local_3c0 = this;
  local_3b4 = target_size;
  if (target_size < 1) {
    poVar4 = (ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"* vertex ",9);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_3c4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," domain\n",8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  }
  else {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_340 + 0x10);
    iVar11 = 0;
    local_348 = (_Any_data *)target_name;
    do {
      _Var2._M_head_impl =
           (local_3c0->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      local_350.first = local_3c4;
      local_380._M_dataplus._M_p._0_4_ = local_3c4;
      local_350.second = iVar11;
      if ((pattern_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*pattern_name->_M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0,
                 (_Any_data *)pattern_name,(int *)&local_380);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_3b0,"_");
      paVar6 = &pbVar3->field_2;
      local_340._0_8_ = (pbVar3->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._0_8_ == paVar6) {
        local_330._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_330._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_340._0_8_ = paVar1;
      }
      else {
        local_330._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_340._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      local_35c = iVar11;
      if (*(long *)(local_348 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_348->_M_pod_data + 0x18))(&local_380,local_348,&local_35c);
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._0_8_ != paVar1) {
        uVar7 = local_330._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_380._M_string_length + local_340._8_8_) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          uVar8 = CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                           local_380.field_2._M_local_buf[0]);
        }
        if (uVar8 < local_380._M_string_length + local_340._8_8_) goto LAB_001194df;
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_380,0,0,(char *)local_340._0_8_,local_340._8_8_);
      }
      else {
LAB_001194df:
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_340,local_380._M_dataplus._M_p,local_380._M_string_length);
      }
      paVar6 = &pbVar3->field_2;
      local_1b8._0_8_ = (pbVar3->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ == paVar6) {
        local_1a8[0]._0_8_ = paVar6->_M_allocated_capacity;
        local_1a8[0]._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_1b8._0_8_ = local_1b8 + 0x10;
      }
      else {
        local_1a8[0]._0_8_ = paVar6->_M_allocated_capacity;
      }
      local_1b8._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar3->_M_string_length = 0;
      paVar6->_M_local_buf[0] = '\0';
      std::
      _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<long,long>const,std::__cxx11::string>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<int,int>,std::__cxx11::string>
                ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<long,long>const,std::__cxx11::string>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::__cxx11::string>>>
                  *)&(_Var2._M_head_impl)->variable_mappings,&local_350,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                                 local_380.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._0_8_ != paVar1) {
        operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.
             super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_3b0.
                     super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl + 0x10U)) {
        operator_delete(local_3b0.
                        super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_dataplus._M_p,
                        local_3b0.
                        super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl.field_2._M_allocated_capacity + 1);
      }
      iVar11 = iVar11 + 1;
    } while (local_3b4 != iVar11);
    poVar4 = (ostream *)
             &((local_3c0->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"* vertex ",9);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_3c4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," domain\n",8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    if (0 < local_3b4) {
      uVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"1 x",3);
        local_340._0_8_ = SEXT48(local_3c4);
        local_340._8_8_ = uVar8;
        pmVar5 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((local_3c0->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,(key_type *)local_340);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_1b8 + 0x10),(pmVar5->_M_dataplus)._M_p,
                            pmVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        uVar8 = uVar8 + 1;
      } while (local_358 != uVar8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),">= 1",4);
  _Var2._M_head_impl =
       (local_3c0->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(_Var2._M_head_impl)->field_0x50,(char *)local_340._0_8_,
                      local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ;\n",3);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_340 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != paVar1) {
    operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl =
       (local_3c0->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  lVar9 = (_Var2._M_head_impl)->nb_constraints + 1;
  (_Var2._M_head_impl)->nb_constraints = lVar9;
  lVar10 = 0;
  if ((_Var2._M_head_impl)->recover_encoding == false) {
    lVar10 = lVar9;
  }
  std::__cxx11::stringbuf::str();
  local_340._8_8_ =
       local_3b0.
       super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl._M_string_length;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_3b0.
                      super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.
         super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p == paVar6) {
    local_330._8_8_ =
         local_3b0.
         super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl.field_2._8_8_;
    local_340._0_8_ = paVar1;
  }
  else {
    local_340._0_8_ =
         local_3b0.
         super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p;
  }
  local_330._M_allocated_capacity =
       local_3b0.
       super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2._M_allocated_capacity;
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0;
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_allocated_capacity =
       local_3b0.
       super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = (pointer)paVar6;
  local_320._M_head_impl = lVar10;
  local_318._M_head_impl = lVar9;
  std::
  _Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<int&,std::tuple<long,long,std::__cxx11::string>>
            ((_Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var2._M_head_impl)->at_least_one_value_constraints,&local_3c4,
             (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != paVar1) {
    operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.
         super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_3b0.
                 super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p,
                    local_3b0.
                    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  if (0 < local_3b4) {
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),"-1 x",4);
      local_3b0.
      super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = (pointer)(long)local_3c4;
      local_3b0.
      super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_string_length = uVar8;
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((local_3c0->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,(key_type *)&local_3b0);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_340 + 0x10),(pmVar5->_M_dataplus)._M_p,
                          pmVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      uVar8 = uVar8 + 1;
    } while (local_358 != uVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),">= -1",5);
  _Var2._M_head_impl =
       (local_3c0->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(_Var2._M_head_impl)->field_0x50,
                      local_3b0.
                      super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p,
                      local_3b0.
                      super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ;\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.
         super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_3b0.
                 super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p,
                    local_3b0.
                    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl =
       (local_3c0->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  lVar9 = (_Var2._M_head_impl)->nb_constraints + 1;
  (_Var2._M_head_impl)->nb_constraints = lVar9;
  lVar10 = 0;
  if ((_Var2._M_head_impl)->recover_encoding == false) {
    lVar10 = lVar9;
  }
  std::__cxx11::stringbuf::str();
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = local_380._M_string_length;
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)((long)&local_3b0.
                        super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl + 0x10);
  paVar1 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p == paVar1) {
    local_3b0.
    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ = local_380.field_2._8_8_;
  }
  else {
    local_3b0.
    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = local_380._M_dataplus._M_p;
  }
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_allocated_capacity._1_7_ = local_380.field_2._M_allocated_capacity._1_7_;
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_local_buf[0] = local_380.field_2._M_local_buf[0];
  local_380._M_string_length = 0;
  local_380.field_2._M_local_buf[0] = '\0';
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<1UL,_long,_false>._M_head_impl = lVar10;
  local_3b0.
  super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<0UL,_long,_false>._M_head_impl = lVar9;
  local_380._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<int&,std::tuple<long,long,std::__cxx11::string>>
            ((_Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var2._M_head_impl)->at_most_one_value_constraints,&local_3c4,&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.
         super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_3b0.
                 super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p,
                    local_3b0.
                    super__Tuple_impl<0UL,_long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,
                    CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                             local_380.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

auto Proof::create_cp_variable(int pattern_vertex, int target_size,
    const function<auto(int)->string> & pattern_name,
    const function<auto(int)->string> & target_name) -> void
{
    for (int i = 0; i < target_size; ++i)
        _imp->variable_mappings.emplace(pair{pattern_vertex, i}, pattern_name(pattern_vertex) + "_" + target_name(i));

    _imp->model_stream << "* vertex " << pattern_vertex << " domain\n";
    stringstream al1_constraint;
    for (int i = 0; i < target_size; ++i)
        al1_constraint << "1 x" << _imp->variable_mappings[{pattern_vertex, i}] << " ";
    al1_constraint << ">= 1";
    _imp->model_stream << al1_constraint.str() << " ;\n";
    long n = ++_imp->nb_constraints;
    _imp->at_least_one_value_constraints.emplace(pattern_vertex, tuple{n, _imp->recover_encoding ? 0 : n, al1_constraint.str()});

    stringstream am1_constraint;
    for (int i = 0; i < target_size; ++i)
        am1_constraint << "-1 x" << _imp->variable_mappings[{pattern_vertex, i}] << " ";
    am1_constraint << ">= -1";
    _imp->model_stream << am1_constraint.str() << " ;\n";
    long m = ++_imp->nb_constraints;
    _imp->at_most_one_value_constraints.emplace(pattern_vertex, tuple{m, _imp->recover_encoding ? 0 : m, am1_constraint.str()});
}